

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

void mg_node_destroy_ca(mg_node *node,mg_allocator *allocator)

{
  mg_map *in_RSI;
  long in_RDI;
  uint32_t i;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar1;
  
  if (in_RDI != 0) {
    for (uVar1 = 0; uVar1 < *(uint *)(in_RDI + 8); uVar1 = uVar1 + 1) {
      mg_string_destroy_ca
                ((mg_string *)in_RSI,(mg_allocator *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
    }
    mg_map_destroy_ca(in_RSI,(mg_allocator *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
    mg_allocator_free((mg_allocator *)in_RSI,(void *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
  }
  return;
}

Assistant:

void mg_node_destroy_ca(mg_node *node, mg_allocator *allocator) {
  if (!node) {
    return;
  }
  for (uint32_t i = 0; i < node->label_count; ++i) {
    mg_string_destroy_ca(node->labels[i], allocator);
  }
  mg_map_destroy_ca(node->properties, allocator);
  mg_allocator_free(allocator, node);
}